

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeXMLProvider::findByMagic(QMimeXMLProvider *this,QByteArray *data,QMimeMagicResult *result)

{
  bool bVar1;
  uint uVar2;
  const_iterator o;
  QMimeMagicRuleMatcher *this_00;
  QByteArray *in_RDX;
  QMimeMagicRuleMatcher *in_RSI;
  long in_FS_OFFSET;
  int priority;
  QMimeMagicRuleMatcher *matcher;
  add_const_t<QList<QMimeMagicRuleMatcher>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  undefined4 in_stack_ffffffffffffff98;
  QList<QMimeMagicRuleMatcher> *in_stack_ffffffffffffffa0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (QMimeMagicRuleMatcher *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QMimeMagicRuleMatcher>::begin(in_stack_ffffffffffffffa0);
  o = QList<QMimeMagicRuleMatcher>::end(in_stack_ffffffffffffffa0);
  while (bVar1 = QList<QMimeMagicRuleMatcher>::const_iterator::operator!=(&local_10,o), bVar1) {
    this_00 = QList<QMimeMagicRuleMatcher>::const_iterator::operator*(&local_10);
    bVar1 = QMimeMagicRuleMatcher::matches(in_RSI,in_RDX);
    if ((bVar1) &&
       (uVar2 = QMimeMagicRuleMatcher::priority(this_00), *(int *)&in_RDX[1].d.d < (int)uVar2)) {
      *(uint *)&in_RDX[1].d.d = uVar2;
      QMimeMagicRuleMatcher::mimetype
                ((QMimeMagicRuleMatcher *)CONCAT44(uVar2,in_stack_ffffffffffffff98));
      QString::operator=((QString *)this_00,(QString *)CONCAT44(uVar2,in_stack_ffffffffffffff98));
      QString::~QString((QString *)0x8fdfcf);
    }
    QList<QMimeMagicRuleMatcher>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeXMLProvider::findByMagic(const QByteArray &data, QMimeMagicResult &result)
{
    for (const QMimeMagicRuleMatcher &matcher : std::as_const(m_magicMatchers)) {
        if (matcher.matches(data)) {
            const int priority = matcher.priority();
            if (priority > result.accuracy) {
                result.accuracy = priority;
                result.candidate = matcher.mimetype();
            }
        }
    }
}